

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_interestingUnits_Test::stringToUnits_interestingUnits_Test
          (stringToUnits_interestingUnits_Test *this)

{
  stringToUnits_interestingUnits_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__stringToUnits_interestingUnits_Test_002f9ce8;
  return;
}

Assistant:

TEST(stringToUnits, interestingUnits)
{
    auto unit = unit_from_string("cubit (UK)");
    EXPECT_TRUE(precise::m.has_same_base(unit));

    unit = unit_from_string("ZAM", case_insensitive);
    EXPECT_EQ(unit, precise_unit(1e21, precise::m));

    unit = unit_from_string("m per s2 per Hz^1/2");
    EXPECT_EQ(unit, precise::special::ASD);

    unit = unit_from_string("tenth minute");
    EXPECT_EQ(unit, precise_unit(6.0, precise::s));

    unit = unit_from_string("fluid ounce(UK)");
    EXPECT_EQ(unit, precise::imp::floz);
}